

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O3

void __thiscall cbtGImpactMeshShape::setLocalScaling(cbtGImpactMeshShape *this,cbtVector3 *scaling)

{
  cbtGImpactMeshShapePart *pcVar1;
  undefined8 uVar2;
  long lVar3;
  
  uVar2 = *(undefined8 *)(scaling->m_floats + 2);
  *(undefined8 *)(this->super_cbtGImpactShapeInterface).localScaling.m_floats =
       *(undefined8 *)scaling->m_floats;
  *(undefined8 *)((this->super_cbtGImpactShapeInterface).localScaling.m_floats + 2) = uVar2;
  for (lVar3 = (long)(this->m_mesh_parts).m_size; lVar3 != 0; lVar3 = lVar3 + -1) {
    pcVar1 = (this->m_mesh_parts).m_data[lVar3 + -1];
    (*(pcVar1->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[6])(pcVar1,scaling);
  }
  (this->super_cbtGImpactShapeInterface).m_needs_update = true;
  return;
}

Assistant:

virtual void setLocalScaling(const cbtVector3& scaling)
	{
		localScaling = scaling;

		int i = m_mesh_parts.size();
		while (i--)
		{
			cbtGImpactMeshShapePart* part = m_mesh_parts[i];
			part->setLocalScaling(scaling);
		}

		m_needs_update = true;
	}